

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void __thiscall
InstantiateConcreteMustFail_Test6_Test::TestBody(InstantiateConcreteMustFail_Test6_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_1b0;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_;
  exception *ex;
  byte local_159;
  undefined1 local_158 [7];
  bool testPass;
  unique_ptr<IBed,_std::default_delete<IBed>_> bed;
  undefined1 local_140 [8];
  Container ioc;
  InstantiateConcreteMustFail_Test6_Test *this_local;
  
  ioc.recursionWaitList.
  super__List_base<std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::allocator<std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>
  ._M_impl._M_node._M_size = (size_t)this;
  Infector::Container::Container((Container *)local_140);
  Infector::Container::bindAs<ComfortableBed,IBed>((Container *)local_140);
  Infector::Container::wire<ComfortableBed>((Container *)local_140);
  Infector::Container::build<IBed>((Container *)local_158);
  local_159 = 0;
  Infector::Container::build<ComfortableBed>((Container *)&ex);
  std::unique_ptr<ComfortableBed,_std::default_delete<ComfortableBed>_>::~unique_ptr
            ((unique_ptr<ComfortableBed,_std::default_delete<ComfortableBed>_> *)&ex);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_180,(bool)(local_159 & 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)local_180,(AssertionResult *)"testPass","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ViteFalcon[P]infectorpp/tests/UnitTest.cpp"
               ,0x1b7,message);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::unique_ptr<IBed,_std::default_delete<IBed>_>::~unique_ptr
            ((unique_ptr<IBed,_std::default_delete<IBed>_> *)local_158);
  Infector::Container::~Container((Container *)local_140);
  return;
}

Assistant:

TEST(InstantiateConcreteMustFail, Test6){
    Infector::Container ioc;

    ioc.bindAs<ComfortableBed,  IBed>();

    ioc.wire<ComfortableBed>();

    auto bed = ioc.build<IBed>();
    bool testPass = false;
    try{
        ioc.build<ComfortableBed>();
    }
    catch(std::exception &ex){
        std::cout<<"ex 1"<<std::endl;
        std::cout<<ex.what()<<std::endl;
        testPass=true;
    }

    EXPECT_TRUE(testPass);
}